

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
 unodb::detail::olc_impl_helpers::
 add_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
           (olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
            *inode,byte key_byte,
           basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k,value_view v,
           olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
           *db_instance,
           tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
           depth,read_critical_section *node_critical_section,
           in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
           *node_in_parent,read_critical_section *parent_critical_section,
           olc_db_leaf_unique_ptr<std::span<const_std::byte>,_std::span<const_std::byte>_>
           *cached_leaf)

{
  atomic<long> *paVar1;
  atomic<unsigned_long> *paVar2;
  long lVar3;
  uint8_t children_count_;
  optimistic_lock *this;
  write_guard ptr_;
  uintptr_t uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  find_result fVar7;
  optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  oVar8;
  write_guard local_58;
  write_guard write_unlock_on_exit;
  write_guard local_48;
  write_guard write_unlock_on_exit_1;
  write_guard node_write_guard;
  
  uVar6 = k.field_0._8_8_;
  fVar7 = basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
          ::find_child(&inode->
                        super_olc_inode_4_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
                       ,key_byte);
  uVar5 = (undefined4)CONCAT71((int7)((ulong)uVar6 >> 8),1);
  if (fVar7.second !=
      (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)0x0)
  goto LAB_0013a7c6;
  create_leaf_if_needed<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
            (cached_leaf,k,v,db_instance);
  children_count_ =
       (inode->super_olc_inode_4_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>).
       field_0x20;
  if (children_count_ != '\x04') {
    local_58.lock = optimistic_lock::write_guard::try_lock_upgrade(node_critical_section);
    if (local_58.lock != (optimistic_lock *)0x0) {
      this = parent_critical_section->lock;
      if ((this->read_lock_count).super___atomic_base<long>._M_i < 1) {
        __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
      }
      if ((parent_critical_section->version).version ==
          (this->version).version.super___atomic_base<unsigned_long>._M_i) {
        LOCK();
        paVar1 = &this->read_lock_count;
        lVar3 = (paVar1->super___atomic_base<long>)._M_i;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0) {
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
        parent_critical_section->lock = (optimistic_lock *)0x0;
        uVar6 = 0;
        basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
        ::add_to_nonfull(&inode->
                          super_olc_inode_4_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
                         ,cached_leaf,(tree_depth_type)depth.value,children_count_);
        optimistic_lock::write_guard::~write_guard(&stack0xffffffffffffffa8);
        uVar5 = (undefined4)CONCAT71((int7)((ulong)uVar6 >> 8),1);
        goto LAB_0013a7c6;
      }
      optimistic_lock::dec_read_lock_count(this);
      parent_critical_section->lock = (optimistic_lock *)0x0;
    }
    optimistic_lock::write_guard::~write_guard(&stack0xffffffffffffffa8);
    uVar5 = 0;
    goto LAB_0013a7c6;
  }
  basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
  ::
  make_db_inode_unique_ptr<unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&>
            ((basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
              *)&stack0xffffffffffffffa8,db_instance,inode);
  local_48.lock = optimistic_lock::write_guard::try_lock_upgrade(parent_critical_section);
  if (local_48.lock == (optimistic_lock *)0x0) {
LAB_0013a8ed:
    optimistic_lock::write_guard::~write_guard(&local_48);
    uVar5 = 0;
  }
  else {
    write_unlock_on_exit_1.lock =
         optimistic_lock::write_guard::try_lock_upgrade(node_critical_section);
    if (write_unlock_on_exit_1.lock == (optimistic_lock *)0x0) {
      optimistic_lock::write_guard::~write_guard(&write_unlock_on_exit_1);
      goto LAB_0013a8ed;
    }
    olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
    ::init((olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
            *)write_unlock_on_exit.lock,(EVP_PKEY_CTX *)db_instance);
    ptr_ = write_unlock_on_exit;
    write_unlock_on_exit.lock = (optimistic_lock *)0x0;
    uVar4 = basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr
                      ((olc_node_header *)ptr_.lock,I16);
    (node_in_parent->value)._M_i.tagged_ptr = uVar4;
    if (write_unlock_on_exit_1.lock != (optimistic_lock *)0x0) {
      __assert_fail("!node_write_guard.active()",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                    ,0x5b8,
                    "static std::optional<in_critical_section<olc_node_ptr> *> unodb::detail::olc_impl_helpers::add_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, value_view, olc_db<Key, Value> &, tree_depth<basic_art_key<Key>>, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, optimistic_lock::read_critical_section &, olc_db_leaf_unique_ptr<Key, Value> &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_4<std::span<const std::byte>, std::span<const std::byte>>]"
                   );
    }
    optimistic_lock::write_guard::~write_guard(&write_unlock_on_exit_1);
    optimistic_lock::write_guard::~write_guard(&local_48);
    LOCK();
    paVar2 = (db_instance->growing_inode_counts)._M_elems + 1;
    (paVar2->super___atomic_base<unsigned_long>)._M_i =
         (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    uVar5 = (undefined4)CONCAT71((int7)((ulong)&write_unlock_on_exit_1 >> 8),1);
  }
  std::
  unique_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 *)&stack0xffffffffffffffa8);
LAB_0013a7c6:
  oVar8.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._8_4_ = uVar5;
  oVar8.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._M_payload._M_value = fVar7.second;
  oVar8.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._12_4_ = 0;
  return (optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
          )oVar8.
           super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
           ._M_payload.
           super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ;
}

Assistant:

[[nodiscard]] std::optional<in_critical_section<olc_node_ptr>*>
olc_impl_helpers::add_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k, value_view v,
    olc_db<Key, Value>& db_instance, tree_depth<basic_art_key<Key>> depth,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    optimistic_lock::read_critical_section& parent_critical_section,
    olc_db_leaf_unique_ptr<Key, Value>& cached_leaf) {
  auto* const child_in_parent = inode.find_child(key_byte).second;

  if (child_in_parent == nullptr) {
    create_leaf_if_needed(cached_leaf, k, v, db_instance);

    const auto children_count = inode.get_children_count();

    if constexpr (!std::is_same_v<INode, olc_inode_256<Key, Value>>) {
      if (UNODB_DETAIL_UNLIKELY(children_count == INode::capacity)) {
        auto larger_node{
            INode::larger_derived_type::create(db_instance, inode)};
        {
          const optimistic_lock::write_guard write_unlock_on_exit{
              std::move(parent_critical_section)};
          if (UNODB_DETAIL_UNLIKELY(write_unlock_on_exit.must_restart()))
            return {};  // LCOV_EXCL_LINE

          optimistic_lock::write_guard node_write_guard{
              std::move(node_critical_section)};
          if (UNODB_DETAIL_UNLIKELY(node_write_guard.must_restart())) return {};

          larger_node->init(db_instance, inode, node_write_guard,
                            std::move(cached_leaf), depth);
          *node_in_parent = detail::olc_node_ptr{
              larger_node.release(), INode::larger_derived_type::type};

          UNODB_DETAIL_ASSERT(!node_write_guard.active());
        }

#ifdef UNODB_DETAIL_WITH_STATS
        db_instance
            .template account_growing_inode<INode::larger_derived_type::type>();
#endif  // UNODB_DETAIL_WITH_STATS

        return child_in_parent;
      }
    }

    const optimistic_lock::write_guard write_unlock_on_exit{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(write_unlock_on_exit.must_restart())) return {};

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    inode.add_to_nonfull(std::move(cached_leaf), depth, children_count);
  }

  return child_in_parent;
}